

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPClient.cpp
# Opt level: O2

string * __thiscall
TCPClient::Send(string *__return_storage_ptr__,TCPClient *this,string *hostname,string *portNumber,
               string *message)

{
  string local_80;
  string local_60;
  string local_40;
  
  std::operator<<((ostream *)&std::cout,"In Linux\n");
  std::__cxx11::string::string((string *)&local_40,(string *)hostname);
  std::__cxx11::string::string((string *)&local_60,(string *)portNumber);
  std::__cxx11::string::string((string *)&local_80,(string *)message);
  Sendnix(__return_storage_ptr__,(TCPClient *)message,&local_40,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string TCPClient::Send(string hostname, string portNumber, string message) {
  // To be used to make it platform independent
  #ifdef __linux__
  std::cout << "In Linux\n";
  #elif _WIN32
  std::cout << "In Windows\n";
  #elif __APPLE__
  std::cout << "Mac Os X\n";
  #else
  std::cout << "Unknown system \n";
  #endif

  // Select the correct platform
  #ifdef __linux__
    return this->Sendnix(hostname, portNumber, message);
  #elif __APPLE__
    return this->Sendnix(hostname, portNumber, message);
  #elif _WIN32
    return this->SendWin(hostname, portNumber, message);
  #endif
}